

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O0

void test_double(void)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  double *pdVar4;
  bson_t *bcon;
  double val;
  
  uVar2 = bson_bcon_magic();
  bcon_ensure_double(1.1);
  uVar2 = bcon_new(0,"foo",uVar2,1);
  uVar3 = bson_bcone_magic();
  pdVar4 = bcon_ensure_double_ptr((double *)&bcon);
  bVar1 = bcon_extract(uVar2,"foo",uVar3,1,pdVar4,0);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x1b,"test_double","BCON_EXTRACT (bcon, \"foo\", BCONE_DOUBLE (val))");
    abort();
  }
  if ((double)bcon != 1.1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x1d,"test_double","val == 1.1");
    abort();
  }
  bson_destroy(uVar2);
  return;
}

Assistant:

static void
test_double (void)
{
   double val;

   bson_t *bcon = BCON_NEW ("foo", BCON_DOUBLE (1.1));

   BSON_ASSERT (BCON_EXTRACT (bcon, "foo", BCONE_DOUBLE (val)));

   BSON_ASSERT (val == 1.1);

   bson_destroy (bcon);
}